

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileCollider.cpp
# Opt level: O3

int __thiscall
solitaire::colliders::StockPileCollider::getCoveredCardsCount(StockPileCollider *this)

{
  uint uVar1;
  int iVar2;
  uint extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  
  uVar1 = (*(this->stockPile->super_Archiver)._vptr_Archiver[7])();
  iVar2 = (*(this->stockPile->super_Archiver)._vptr_Archiver[6])();
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
  if ((extraout_var & 1) == 0) {
    iVar2 = (int)((ulong)(plVar3[1] - *plVar3) >> 3);
  }
  else {
    iVar2 = (int)((ulong)(plVar3[1] - *plVar3) >> 3) + ~uVar1;
  }
  return iVar2;
}

Assistant:

int StockPileCollider::getCoveredCardsCount() const {
    const auto selectedCardIndex = stockPile.getSelectedCardIndex();
    const auto& cards = stockPile.getCards();

    if (selectedCardIndex)
        return cards.size() - (selectedCardIndex.value() + 1);
    return cards.size();
}